

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O2

int ffu4fi2(unsigned_long *input,long ntodo,double scale,double zero,short *output,int *status)

{
  long lVar1;
  long lVar2;
  short sVar3;
  ulong uVar4;
  double dVar5;
  
  lVar1 = 0;
  if (0 < ntodo) {
    lVar1 = ntodo;
  }
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      dVar5 = ((((double)CONCAT44(0x45300000,(int)(input[lVar2] >> 0x20)) - 1.9342813113834067e+25)
               + ((double)CONCAT44(0x43300000,(int)input[lVar2]) - 4503599627370496.0)) - zero) /
              scale;
      if (-32768.49 <= dVar5) {
        if (dVar5 <= 32767.49) {
          if (0.0 <= dVar5) {
            dVar5 = dVar5 + 0.5;
          }
          else {
            dVar5 = dVar5 + -0.5;
          }
          sVar3 = (short)(int)dVar5;
        }
        else {
          *status = -0xb;
          sVar3 = 0x7fff;
        }
      }
      else {
        *status = -0xb;
        sVar3 = -0x8000;
      }
      output[lVar2] = sVar3;
    }
  }
  else {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      uVar4 = input[lVar2];
      if (0x7fff < uVar4) {
        *status = -0xb;
        uVar4 = 0x7fff;
      }
      output[lVar2] = (short)uVar4;
    }
  }
  return *status;
}

Assistant:

int ffu4fi2(unsigned long *input, /* I - array of values to be converted */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            short *output,     /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] > SHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MAX;
            }
            else
                output[ii] = (short) input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DSHRT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MIN;
            }
            else if (dvalue > DSHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (short) (dvalue + .5);
                else
                    output[ii] = (short) (dvalue - .5);
            }
        }
    }
    return(*status);
}